

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::get_ip_address(upnp *this,rootdevice *d)

{
  bool bVar1;
  undefined8 uVar2;
  double __x;
  char local_428 [8];
  char soap [1024];
  char *soap_action;
  rootdevice *d_local;
  upnp *this_local;
  
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&d->upnp_connection);
  if (bVar1) {
    uVar2 = ::std::__cxx11::string::c_str();
    snprintf(local_428,0x400,
             "<?xml version=\"1.0\"?>\n<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\"><s:Body><u:%s xmlns:u=\"%s\"></u:%s></s:Body></s:Envelope>"
             ,"GetExternalIPAddress",uVar2,"GetExternalIPAddress");
    post(this,d,local_428,"GetExternalIPAddress");
  }
  else {
    log(this,__x);
  }
  return;
}

Assistant:

void upnp::get_ip_address(rootdevice& d)
{
	TORRENT_ASSERT(is_single_thread());

	TORRENT_ASSERT(d.magic == 1337);

	if (!d.upnp_connection)
	{
		TORRENT_ASSERT(d.disabled);
#ifndef TORRENT_DISABLE_LOGGING
		log("getting external IP address");
#endif
		return;
	}

	char const* soap_action = "GetExternalIPAddress";

	char soap[1024];
	std::snprintf(soap, sizeof(soap), "<?xml version=\"1.0\"?>\n"
		"<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">"
		"<s:Body><u:%s xmlns:u=\"%s\">"
		"</u:%s></s:Body></s:Envelope>"
		, soap_action, d.service_namespace.c_str()
		, soap_action);

	post(d, soap, soap_action);
}